

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int64_t float128_to_int64_mips64el(float128 a,float_status *status)

{
  int64_t iVar1;
  byte bVar2;
  uint uVar3;
  uint64_t absZ1;
  uint64_t absZ0;
  uint64_t aSig0;
  uint64_t local_30;
  uint64_t local_28;
  
  local_28 = a.low;
  local_30 = a.high & 0xffffffffffff;
  uVar3 = a.high._6_2_ & 0x7fff;
  if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) ||
     (local_30 = local_30 + 0x1000000000000, uVar3 < 0x402f)) {
    shift64ExtraRightJamming(local_30,local_28,0x402f - uVar3,&local_30,&local_28);
    absZ1 = local_28;
    absZ0 = local_30;
  }
  else {
    if (0x403e < uVar3) {
      status->float_exception_flags = status->float_exception_flags | 1;
      iVar1 = 0x7fffffffffffffff;
      if ((long)a.high < 0) {
        if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
            local_28 == 0) {
          iVar1 = -0x8000000000000000;
        }
        if (uVar3 != 0x7fff) {
          iVar1 = -0x8000000000000000;
        }
      }
      return iVar1;
    }
    bVar2 = (byte)(uVar3 - 0x402f);
    absZ1 = local_28 << (bVar2 & 0x3f);
    absZ0 = local_30;
    if (uVar3 - 0x402f != 0) {
      absZ0 = local_30 << (bVar2 & 0x3f) | local_28 >> (0x2fU - a.high._6_1_ & 0x3f);
    }
  }
  iVar1 = roundAndPackInt64(a.high._7_1_ >> 7,absZ0,absZ1,status);
  return iVar1;
}

Assistant:

int64_t float128_to_int64(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp ) aSig0 |= UINT64_C(0x0001000000000000);
    shiftCount = 0x402F - aExp;
    if ( shiftCount <= 0 ) {
        if ( 0x403E < aExp ) {
            float_raise(float_flag_invalid, status);
            if (    ! aSign
                 || (    ( aExp == 0x7FFF )
                      && ( aSig1 || ( aSig0 != UINT64_C(0x0001000000000000) ) )
                    )
               ) {
                return INT64_MAX;
            }
            return INT64_MIN;
        }
        shortShift128Left( aSig0, aSig1, - shiftCount, &aSig0, &aSig1 );
    }
    else {
        shift64ExtraRightJamming( aSig0, aSig1, shiftCount, &aSig0, &aSig1 );
    }
    return roundAndPackInt64(aSign, aSig0, aSig1, status);

}